

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O3

bool Js::JavascriptNumber::IsInt32_NoChecks(Var number)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double value;
  
  if (number == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x94,"(number)","number");
    if (!bVar2) goto LAB_00cd91c0;
    *puVar3 = 0;
LAB_00cd90e5:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x95,"(Is(number))","Is(number)");
    if (!bVar2) goto LAB_00cd91c0;
    *puVar3 = 0;
  }
  else if (number < (Var)0x4000000000000) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    goto LAB_00cd90e5;
  }
  if (number < (Var)0x4000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                ,0xd4,"(Is(aValue))","Ensure var is actually a \'JavascriptNumber\'"
                               );
    if (!bVar2) {
LAB_00cd91c0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  value = (double)((ulong)number ^ 0xfffc000000000000);
  if (((double)(int)value != value) || (NAN((double)(int)value) || NAN(value))) {
    bVar2 = false;
  }
  else {
    bVar2 = NumberUtilities::IsSpecial(value,0x8000000000000000);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool JavascriptNumber::IsInt32_NoChecks(const Var number)
    {
        Assert(number);
        Assert(Is(number));

        return IsInt32(GetValue(number));
    }